

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_FunctionBuilder.h
# Opt level: O0

void __thiscall soul::FunctionBuilder::endFunction(FunctionBuilder *this)

{
  bool bVar1;
  Function *pFVar2;
  reference this_00;
  Block *pBVar3;
  Iterator local_20;
  pool_ptr<soul::heart::Block> local_18;
  FunctionBuilder *local_10;
  FunctionBuilder *this_local;
  
  local_10 = this;
  bVar1 = pool_ptr<soul::heart::Function>::operator!=(&this->currentFunction,(void *)0x0);
  if (bVar1) {
    pFVar2 = pool_ptr<soul::heart::Function>::operator->(&this->currentFunction);
    bVar1 = std::
            vector<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
            ::empty(&pFVar2->blocks);
    if (!bVar1) {
      pFVar2 = pool_ptr<soul::heart::Function>::operator->(&this->currentFunction);
      this_00 = std::
                vector<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
                ::front(&pFVar2->blocks);
      pBVar3 = pool_ref<soul::heart::Block>::operator->(this_00);
      pBVar3->doNotOptimiseAway = true;
    }
  }
  pool_ptr<soul::heart::Block>::pool_ptr(&local_18);
  (this->super_BlockBuilder).currentBlock.object = local_18.object;
  pool_ptr<soul::heart::Block>::~pool_ptr(&local_18);
  memset(&local_20,0,8);
  LinkedList<soul::heart::Statement>::Iterator::Iterator(&local_20);
  (this->super_BlockBuilder).lastStatementInCurrentBlock.object = local_20.object;
  return;
}

Assistant:

void endFunction()
    {
        if (currentFunction != nullptr)
            if (! currentFunction->blocks.empty())
                currentFunction->blocks.front()->doNotOptimiseAway = true;

        currentBlock = {};
        lastStatementInCurrentBlock = {};
    }